

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_entropy(inform_dist *dist,double base)

{
  uint64_t uVar1;
  _Bool _Var2;
  double dVar3;
  double __x;
  double dVar4;
  undefined1 auVar5 [16];
  double p;
  size_t i;
  double h;
  size_t n;
  double base_local;
  inform_dist *dist_local;
  
  _Var2 = inform_dist_is_valid(dist);
  if (_Var2) {
    dVar3 = (double)inform_dist_size(dist);
    i = 0;
    for (p = 0.0; (ulong)p < (ulong)dVar3; p = (double)((long)p + 1)) {
      if (dist->histogram[(long)p] != 0) {
        uVar1 = dist->counts;
        auVar5._8_4_ = (int)(uVar1 >> 0x20);
        auVar5._0_8_ = uVar1;
        auVar5._12_4_ = 0x45300000;
        __x = (double)dist->histogram[(long)p] /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        dVar4 = log2(__x);
        i = (size_t)(-__x * dVar4 + (double)i);
      }
    }
    dVar3 = log2(base);
    dist_local = (inform_dist *)((double)i / dVar3);
  }
  else {
    dist_local = (inform_dist *)0x7ff8000000000000;
  }
  return (double)dist_local;
}

Assistant:

double inform_shannon_entropy(inform_dist const *dist, double base)
{
    // ensure that the distribution is valid
    if (inform_dist_is_valid(dist))
    {
        // get the size of the distribution's support
        size_t const n = inform_dist_size(dist);
        double h = 0.;
        // for each element of the distribution's support
        for (size_t i = 0; i < n; ++i)
        {
            // the observation_count is non-zero
            if (dist->histogram[i] != 0)
            {
                // get the probability
                double const p = (double) dist->histogram[i] / dist->counts;
                // accumulate the weighted self-information of the event
                h -= p * log2(p);
            }
        }
        // return the entropy
        return h / log2(base);
    }
    // return NaN if the distribution is invalid
    return NAN;
}